

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::IfcOccupant(IfcOccupant *this)

{
  IfcOccupant *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x120,"IfcOccupant");
  IfcActor::IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__0107c420);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL> *)
             &(this->super_IfcActor).field_0xf0,&PTR_construction_vtable_24__0107c4d0);
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0x107c340;
  *(undefined8 *)&this->field_0x120 = 0x107c408;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0x107c368;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0x107c390;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0x107c3b8;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0x107c3e0;
  std::__cxx11::string::string((string *)&(this->super_IfcActor).field_0x100);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}